

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall
Instance::Instance(Instance *this,Graph *g,vector<Train,_std::allocator<Train>_> *trains,
                  uint32_t maxTimeSteps,context *c)

{
  OccupiedType *this_00;
  pointer pTVar1;
  pointer pTVar2;
  long lVar3;
  ostream *poVar4;
  clock_t cVar5;
  clock_t cVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  context local_220 [2];
  context local_200;
  EdgeSet reachable;
  stringstream bVarName;
  ostream local_1a8 [376];
  
  this->_vptr_Instance = (_func_int **)&PTR_enforceConstraints_00116c70;
  this->constraint_t = 0.0;
  this->solve_t = 0.0;
  Graph::Graph(&this->graph,g);
  std::vector<Train,_std::allocator<Train>_>::vector(&this->trains,trains);
  this->maxTimeSteps = maxTimeSteps;
  this->c = c;
  z3::optimize::optimize(&this->solver,c);
  pTVar1 = (trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar2 = (trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
           super__Vector_impl_data._M_start;
  z3::ast_vector_tpl<z3::expr>::ast_vector_tpl((ast_vector_tpl<z3::expr> *)&reachable,c);
  std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>::vector
            ((vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_> *
             )&bVarName,(ulong)maxTimeSteps,(value_type *)&reachable,(allocator_type *)local_220);
  this_00 = &this->occupiedVars;
  std::
  vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
  ::vector(this_00,((long)pTVar1 - (long)pTVar2) / 0x50,(value_type *)&bVarName,
           (allocator_type *)&local_200);
  std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>::~vector
            ((vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_> *
             )&bVarName);
  z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl((ast_vector_tpl<z3::expr> *)&reachable);
  z3::ast_vector_tpl<z3::expr>::ast_vector_tpl(&this->borderVars,c);
  std::
  vector<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
  ::vector(&this->trainPaths,
           ((long)(trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
                 super__Vector_impl_data._M_start) / 0x50,(allocator_type *)&bVarName);
  (this->constraints).super__Vector_base<z3::expr,_std::allocator<z3::expr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->constraints).super__Vector_base<z3::expr,_std::allocator<z3::expr>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constraints).super__Vector_base<z3::expr,_std::allocator<z3::expr>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar8 = 0; iVar8 < g->vertexCount; iVar8 = iVar8 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&bVarName);
    poVar4 = std::operator<<(local_1a8,"border_");
    std::ostream::operator<<(poVar4,iVar8);
    std::__cxx11::stringbuf::str();
    z3::context::bool_const(local_220,&c->m_enable_exceptions);
    z3::ast_vector_tpl<z3::expr>::push_back(&this->borderVars,(expr *)local_220);
    z3::ast::~ast((ast *)local_220);
    std::__cxx11::string::~string((string *)&reachable);
    std::__cxx11::stringstream::~stringstream((stringstream *)&bVarName);
  }
  reachable._M_h._M_buckets = &reachable._M_h._M_single_bucket;
  uVar9 = 0;
  reachable._M_h._M_bucket_count = 1;
  reachable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  reachable._M_h._M_element_count = 0;
  reachable._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  reachable._M_h._M_rehash_policy._M_next_resize = 0;
  reachable._M_h._M_single_bucket = (__node_base_ptr)0x0;
  while( true ) {
    pTVar1 = (trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pTVar1) / 0x50) <= uVar9) break;
    Graph::paths((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                  *)&bVarName,&this->graph,pTVar1[uVar9].start.stopEdge,
                 (*(pointer *)
                   ((long)&pTVar1[uVar9].stops.super__Vector_base<Stop,_std::allocator<Stop>_>.
                           _M_impl + 8))[-1].stopEdge);
    std::
    vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
    ::_M_move_assign((this->trainPaths).
                     super__Vector_base<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar9,
                     (ast_vector_tpl<z3::expr> *)&bVarName);
    std::
    vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
    ::~vector((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
               *)&bVarName);
    for (uVar10 = (ulong)(trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar9].start.arrivalTime;
        uVar10 < maxTimeSteps; uVar10 = uVar10 + 1) {
      z3::ast_vector_tpl<z3::expr>::ast_vector_tpl((ast_vector_tpl<z3::expr> *)&bVarName,c);
      z3::ast_vector_tpl<z3::expr>::operator=
                ((ast_vector_tpl<z3::expr> *)
                 (*(long *)&(this_00->
                            super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar9].
                            super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                            ._M_impl.super__Vector_impl_data + uVar10 * 0x10),
                 (ast_vector_tpl<z3::expr> *)&bVarName);
      z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl((ast_vector_tpl<z3::expr> *)&bVarName);
      for (uVar7 = 0;
          uVar7 < (ulong)((long)(this->graph).edges.
                                super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)(this->graph).edges.
                                super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&bVarName);
        poVar4 = std::operator<<(local_1a8,"occupies_");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,"_");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,"_");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        lVar3 = *(long *)&(this_00->
                          super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar9].
                          super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                          ._M_impl.super__Vector_impl_data;
        std::__cxx11::stringbuf::str();
        z3::context::bool_const(&local_200,&c->m_enable_exceptions);
        z3::ast_vector_tpl<z3::expr>::push_back
                  ((ast_vector_tpl<z3::expr> *)(lVar3 + uVar10 * 0x10),(expr *)&local_200);
        z3::ast::~ast((ast *)&local_200);
        std::__cxx11::string::~string((string *)local_220);
        std::__cxx11::stringstream::~stringstream((stringstream *)&bVarName);
      }
    }
    uVar9 = uVar9 + 1;
  }
  cVar5 = clock();
  computeConstraints(this);
  cVar6 = clock();
  this->constraint_t = ((double)(cVar6 - cVar5) * 1000.0) / 1000000.0 + this->constraint_t;
  std::
  _Hashtable<const_Edge_*,_const_Edge_*,_std::allocator<const_Edge_*>,_std::__detail::_Identity,_std::equal_to<const_Edge_*>,_std::hash<const_Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&reachable._M_h);
  return;
}

Assistant:

Instance::Instance(Graph g, std::vector<Train> trains, uint32_t maxTimeSteps,
                   context *c)
    : graph(g), trains(trains), maxTimeSteps(maxTimeSteps), c(c), solver(*c),
      occupiedVars(trains.size(), std::vector<expr_vector>(maxTimeSteps, *c)),
      borderVars(*c), trainPaths(trains.size()) {
  // init boundary variables
  for (int i = 0; i < g.vertexCount; i++) {
    std::stringstream bVarName;
    bVarName << "border_" << i;
    borderVars.push_back(c->bool_const(bVarName.str().c_str()));
  }

  EdgeSet reachable;
  // init occupied variables and train paths
  for (size_t train = 0; train < trains.size(); train++) {
    trainPaths[train] = graph.paths(trains[train].start.stopEdge,
                                    trains[train].stops.back().stopEdge);
    for (size_t time = trains[train].start.arrivalTime; time < maxTimeSteps;
         time++) {
      occupiedVars[train][time] = expr_vector(*c);
      for (size_t edge = 0; edge < graph.edges.size(); edge++) {
        std::stringstream oVarName;
        oVarName << "occupies_" << train << "_" << time << "_" << edge;
        occupiedVars[train][time].push_back(
            c->bool_const(oVarName.str().c_str()));
      }
    }
  }
  std::clock_t c_start = std::clock();
  computeConstraints();
  std::clock_t c_end = std::clock();
  constraint_t += 1000.0 * (c_end - c_start) / CLOCKS_PER_SEC;
}